

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O0

void PrintFunction(InstructionVMGraphContext *ctx,VmFunction *function)

{
  FunctionData *pFVar1;
  ScopeData *pSVar2;
  VariableData *pVVar3;
  VmConstant *pVVar4;
  bool bVar5;
  uint uVar6;
  ArgumentData *pAVar7;
  VariableData **ppVVar8;
  VmConstant **ppVVar9;
  VmValue **ppVVar10;
  VmInstruction *value_00;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  VmBlock *local_88;
  VmBlock *value;
  bool simpleUse;
  VmInstruction *inst;
  uint k;
  VmConstant *user;
  uint i_2;
  bool addressTaken;
  VariableData *variable;
  uint i_1;
  ScopeData *scope;
  ArgumentData *argument;
  uint i;
  FunctionData *fData;
  VmFunction *function_local;
  InstructionVMGraphContext *ctx_local;
  
  pFVar1 = function->function;
  if (pFVar1 == (FunctionData *)0x0) {
    PrintLine(ctx,"function global()");
  }
  else {
    if ((pFVar1->importModule != (ModuleData *)0x0) &&
       (bVar5 = SmallArray<VmValue_*,_8U>::empty(&(function->super_VmValue).users), bVar5)) {
      return;
    }
    PrintUsers(ctx,&function->super_VmValue,true);
    Print(ctx,"function ");
    PrintType(ctx,function->returnType);
    Print(ctx," %.*s.f%04x(",
          (ulong)(uint)((int)(pFVar1->name->name).end - (int)(pFVar1->name->name).begin),
          (pFVar1->name->name).begin,(ulong)pFVar1->uniqueId);
    for (argument._4_4_ = 0; uVar6 = SmallArray<ArgumentData,_4U>::size(&pFVar1->arguments),
        argument._4_4_ < uVar6; argument._4_4_ = argument._4_4_ + 1) {
      pAVar7 = SmallArray<ArgumentData,_4U>::operator[](&pFVar1->arguments,argument._4_4_);
      pcVar12 = ", ";
      if (argument._4_4_ == 0) {
        pcVar12 = "";
      }
      pcVar11 = "";
      if ((pAVar7->isExplicit & 1U) != 0) {
        pcVar11 = "explicit ";
      }
      Print(ctx,"%s%s%.*s %.*s",pcVar12,pcVar11,
            (ulong)(uint)((int)(pAVar7->type->name).end - (int)(pAVar7->type->name).begin),
            (pAVar7->type->name).begin,
            (int)(pAVar7->name->name).end - (int)(pAVar7->name->name).begin,
            (pAVar7->name->name).begin);
    }
    pcVar12 = "";
    if (function->firstBlock == (VmBlock *)0x0) {
      pcVar12 = ";";
    }
    Print(ctx,")%s",pcVar12);
    if (pFVar1->importModule != (ModuleData *)0x0) {
      Print(ctx," from \'%.*s\'",
            (ulong)(uint)((int)(pFVar1->importModule->name).end -
                         (int)(pFVar1->importModule->name).begin),(pFVar1->importModule->name).begin
           );
    }
    PrintLine(ctx);
    if (function->firstBlock == (VmBlock *)0x0) {
      return;
    }
  }
  pSVar2 = function->scope;
  if (pSVar2 != (ScopeData *)0x0) {
    for (variable._4_4_ = 0; uVar6 = SmallArray<VariableData_*,_4U>::size(&pSVar2->allVariables),
        variable._4_4_ < uVar6; variable._4_4_ = variable._4_4_ + 1) {
      ppVVar8 = SmallArray<VariableData_*,_4U>::operator[](&pSVar2->allVariables,variable._4_4_);
      pVVar3 = *ppVVar8;
      if (((pVVar3->isAlloca & 1U) == 0) ||
         (bVar5 = SmallArray<VmConstant_*,_8U>::empty(&pVVar3->users), !bVar5)) {
        pcVar12 = "";
        if (pVVar3->importModule != (ModuleData *)0x0) {
          pcVar12 = "imported ";
        }
        Print(ctx,"// %s0x%x: %.*s %.*s",pcVar12,(ulong)pVVar3->offset,
              (ulong)(uint)((int)(pVVar3->type->name).end - (int)(pVVar3->type->name).begin),
              (pVVar3->type->name).begin,
              (int)(pVVar3->name->name).end - (int)(pVVar3->name->name).begin,
              (pVVar3->name->name).begin);
        if ((ctx->showUsers & 1U) != 0) {
          Print(ctx," [");
        }
        bVar5 = false;
        for (user._0_4_ = 0; uVar6 = SmallArray<VmConstant_*,_8U>::size(&pVVar3->users),
            (uint)user < uVar6; user._0_4_ = (uint)user + 1) {
          ppVVar9 = SmallArray<VmConstant_*,_8U>::operator[](&pVVar3->users,(uint)user);
          pVVar4 = *ppVVar9;
          for (inst._4_4_ = 0;
              uVar6 = SmallArray<VmValue_*,_8U>::size(&(pVVar4->super_VmValue).users),
              inst._4_4_ < uVar6; inst._4_4_ = inst._4_4_ + 1) {
            if (((ctx->showUsers & 1U) != 0) && (((uint)user != 0 || (inst._4_4_ != 0)))) {
              Print(ctx,", ");
            }
            ppVVar10 = SmallArray<VmValue_*,_8U>::operator[]
                                 (&(pVVar4->super_VmValue).users,inst._4_4_);
            value_00 = getType<VmInstruction>(*ppVVar10);
            if (value_00 == (VmInstruction *)0x0) {
              __assert_fail("!\"invalid constant use\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                            ,0x2b3,"void PrintFunction(InstructionVMGraphContext &, VmFunction *)");
            }
            if ((ctx->showUsers & 1U) != 0) {
              PrintName(ctx,&value_00->super_VmValue,value_00->parent->parent != function,true);
            }
            if (((int)value_00->cmd < 0) || (6 < (int)value_00->cmd)) {
              if (((int)value_00->cmd < 8) ||
                 ((0xe < (int)value_00->cmd ||
                  (ppVVar10 = SmallArray<VmValue_*,_4U>::operator[](&value_00->arguments,0),
                  (VmConstant *)*ppVVar10 != pVVar4)))) {
                if ((value_00->cmd == VM_INST_MEM_COPY) &&
                   ((ppVVar10 = SmallArray<VmValue_*,_4U>::operator[](&value_00->arguments,0),
                    (VmConstant *)*ppVVar10 == pVVar4 ||
                    (ppVVar10 = SmallArray<VmValue_*,_4U>::operator[](&value_00->arguments,2),
                    (VmConstant *)*ppVVar10 == pVVar4)))) {
                  bVar13 = true;
                }
                else if ((value_00->cmd == VM_INST_SET_RANGE) &&
                        (ppVVar10 = SmallArray<VmValue_*,_4U>::operator[](&value_00->arguments,0),
                        (VmConstant *)*ppVVar10 == pVVar4)) {
                  bVar13 = true;
                }
                else if ((value_00->cmd == VM_INST_RETURN) || (value_00->cmd == VM_INST_CALL)) {
                  bVar13 = (pVVar4->isReference & 1U) != 0;
                }
                else if ((((int)value_00->cmd < 0x33) || (0x43 < (int)value_00->cmd)) ||
                        (ppVVar10 = SmallArray<VmValue_*,_4U>::operator[](&value_00->arguments,1),
                        (VmConstant *)*ppVVar10 != pVVar4)) {
                  bVar13 = false;
                }
                else {
                  bVar13 = true;
                }
              }
              else {
                bVar13 = true;
              }
            }
            else {
              bVar13 = true;
            }
            if (!bVar13) {
              bVar5 = true;
            }
          }
        }
        if ((ctx->showUsers & 1U) != 0) {
          Print(ctx,"]");
        }
        if (!bVar5) {
          Print(ctx," noalias");
        }
        if ((pVVar3->isAlloca & 1U) != 0) {
          Print(ctx," alloca");
        }
        if (pVVar3->importModule != (ModuleData *)0x0) {
          Print(ctx," from \'%.*s\'",
                (ulong)(uint)((int)(pVVar3->importModule->name).end -
                             (int)(pVVar3->importModule->name).begin),
                (pVVar3->importModule->name).begin);
        }
        PrintLine(ctx);
      }
    }
  }
  PrintLine(ctx,"{");
  for (local_88 = function->firstBlock; local_88 != (VmBlock *)0x0; local_88 = local_88->nextSibling
      ) {
    PrintBlock(ctx,local_88);
  }
  PrintLine(ctx,"}");
  PrintLine(ctx);
  return;
}

Assistant:

void PrintFunction(InstructionVMGraphContext &ctx, VmFunction *function)
{
	if(FunctionData *fData = function->function)
	{
		if(fData->importModule != NULL && function->users.empty())
			return;

		PrintUsers(ctx, function, true);

		Print(ctx, "function ");
		PrintType(ctx, function->returnType);
		Print(ctx, " %.*s.f%04x(", FMT_ISTR(fData->name->name), fData->uniqueId);

		for(unsigned i = 0; i < fData->arguments.size(); i++)
		{
			ArgumentData &argument = fData->arguments[i];

			Print(ctx, "%s%s%.*s %.*s", i == 0 ? "" : ", ", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name), FMT_ISTR(argument.name->name));
		}

		Print(ctx, ")%s", function->firstBlock == NULL ? ";" : "");

		if(fData->importModule)
			Print(ctx, " from '%.*s'", FMT_ISTR(fData->importModule->name));

		PrintLine(ctx);

		if(function->firstBlock == NULL)
			return;
	}
	else
	{
		PrintLine(ctx, "function global()");
	}

	if(ScopeData *scope = function->scope)
	{
		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			Print(ctx, "// %s0x%x: %.*s %.*s", variable->importModule ? "imported " : "", variable->offset, FMT_ISTR(variable->type->name), FMT_ISTR(variable->name->name));

			if(ctx.showUsers)
				Print(ctx, " [");

			bool addressTaken = false;

			for(unsigned i = 0; i < variable->users.size(); i++)
			{
				VmConstant *user = variable->users[i];

				for(unsigned k = 0; k < user->users.size(); k++)
				{
					if(ctx.showUsers)
					{
						if(i != 0 || k != 0)
							Print(ctx, ", ");
					}

					if(VmInstruction *inst = getType<VmInstruction>(user->users[k]))
					{
						if(ctx.showUsers)
							PrintName(ctx, inst, inst->parent->parent != function, true);

						bool simpleUse = false;

						if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
						{
							simpleUse = true;
						}
						else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL)
						{
							if(user->isReference)
								simpleUse = true;
							else
								simpleUse = false;
						}
						else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
						{
							simpleUse = true;
						}
						else
						{
							simpleUse = false;
						}

						if(!simpleUse)
							addressTaken = true;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}
			}

			if(ctx.showUsers)
				Print(ctx, "]");

			if(!addressTaken)
				Print(ctx, " noalias");

			if(variable->isAlloca)
				Print(ctx, " alloca");

			if(variable->importModule)
				Print(ctx, " from '%.*s'", FMT_ISTR(variable->importModule->name));

			PrintLine(ctx);
		}
	}

	PrintLine(ctx, "{");

	for(VmBlock *value = function->firstBlock; value; value = value->nextSibling)
		PrintBlock(ctx, value);
	
	PrintLine(ctx, "}");
	PrintLine(ctx);
}